

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

string * __thiscall
tinyusdz::Attribute::type_name_abi_cxx11_(string *__return_storage_ptr__,Attribute *this)

{
  bool bVar1;
  
  if ((this->_type_name)._M_string_length == 0) {
    bVar1 = is_connection(this);
    if (bVar1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      primvar::PrimVar::type_name_abi_cxx11_(__return_storage_ptr__,&this->_var);
    }
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->_type_name);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string type_name() const {
    if (_type_name.size()) {
      return _type_name;
    }

    if (!is_connection()) {
      // Fallback. May be unreliable(`var` could be empty).
      return _var.type_name();
    }

    return std::string();
  }